

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseBinaryExpression
          (Parser *this,ExpressionSyntax *left,
          bitmask<slang::parsing::detail::ExpressionOptions> options,int precedence)

{
  SyntaxFactory *this_00;
  uint uVar1;
  bool bVar2;
  SyntaxKind SVar3;
  int iVar4;
  DistConstraintListSyntax *distribution;
  SourceLocation location;
  Diagnostic *this_01;
  ConditionalPredicateSyntax *predicate;
  ExpressionSyntax *pEVar5;
  ExpressionSyntax *right;
  SyntaxKind kind;
  bitmask<slang::parsing::detail::ExpressionOptions> options_00;
  char cVar6;
  bool bVar7;
  Token TVar8;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar9;
  SourceRange range;
  AttrList AVar10;
  Token question;
  ConditionalExpressionSyntax *local_d0;
  Token local_98;
  Token local_88;
  SyntaxNode *local_78;
  SyntaxNode *pSStack_70;
  size_t local_68;
  AttrList local_60;
  Token local_50;
  Token local_40;
  
  Token::Token(&local_98);
  this_00 = &this->factory;
  local_d0 = (ConditionalExpressionSyntax *)left;
  do {
    local_98 = ParserBase::peek(&this->super_ParserBase);
    SVar3 = slang::syntax::SyntaxFacts::getBinaryExpression(local_98.kind);
    cVar6 = (char)options.m_bits;
    if ((int)SVar3 < 0x117) {
      if (SVar3 == Unknown) goto LAB_0067b259;
LAB_0067b1b2:
      if (SVar3 == LogicalAndExpression) goto LAB_0067b1de;
LAB_0067b1e4:
      if ((SVar3 == MultiplyExpression) &&
         (TVar8 = ParserBase::peek(&this->super_ParserBase,1), TVar8.kind == CloseParenthesis)) {
        local_88 = ParserBase::peek(&this->super_ParserBase,1);
        sVar9 = Token::trivia(&local_88);
        if (sVar9._M_extent._M_extent_value._M_extent_value == 0) goto LAB_0067b259;
      }
      kind = NonblockingAssignmentExpression;
      if ((options.m_bits & 2) == 0) {
        kind = LessThanEqualExpression;
      }
      if (SVar3 != LessThanEqualExpression) {
        kind = SVar3;
      }
      options_00.m_bits = options.m_bits & 0x1fd;
      iVar4 = slang::syntax::SyntaxFacts::getPrecedence(kind);
      if ((iVar4 < precedence) ||
         ((iVar4 == precedence &&
          (bVar7 = slang::syntax::SyntaxFacts::isRightAssociative(kind), !bVar7)))) {
        options.m_bits = options_00.m_bits;
        bVar7 = false;
      }
      else if (kind == ExpressionOrDist) {
        distribution = parseDistConstraintList(this);
        local_d0 = (ConditionalExpressionSyntax *)
                   slang::syntax::SyntaxFactory::expressionOrDist
                             (this_00,&local_d0->super_ExpressionSyntax,distribution);
        bVar7 = true;
        options.m_bits = options_00.m_bits;
        if (-1 < cVar6) {
          location = Token::location(&distribution->dist);
          this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x6b0005,location);
          range = slang::syntax::SyntaxNode::sourceRange(&distribution->super_SyntaxNode);
          Diagnostic::operator<<(this_01,range);
        }
      }
      else if (kind == InsideExpression) {
        local_d0 = (ConditionalExpressionSyntax *)
                   parseInsideExpression(this,&local_d0->super_ExpressionSyntax);
        options.m_bits = options_00.m_bits;
        bVar7 = true;
      }
      else {
        TVar8 = ParserBase::consume(&this->super_ParserBase);
        AVar10 = parseAttributes(this);
        pEVar5 = parseSubExpression(this,options_00,iVar4);
        local_88.info._0_4_ = 1;
        local_78 = (SyntaxNode *)0x0;
        pSStack_70 = (SyntaxNode *)0x0;
        local_88._0_8_ = &PTR_getChild_00cb67f8;
        local_68 = AVar10._M_extent._M_extent_value._M_extent_value;
        local_60 = AVar10;
        local_d0 = (ConditionalExpressionSyntax *)
                   slang::syntax::SyntaxFactory::binaryExpression
                             (this_00,kind,&local_d0->super_ExpressionSyntax,TVar8,
                              (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_88,pEVar5
                             );
        bVar2 = slang::syntax::SyntaxFacts::isAssignmentOperator(kind);
        uVar1 = options.m_bits >> 8;
        bVar7 = true;
        options.m_bits = options_00.m_bits;
        if (((byte)uVar1 & 1 | bVar2) == 1) {
          errorIfAttributes(this,AVar10);
          bVar7 = true;
        }
      }
    }
    else {
      if (SVar3 == LogicalOrExpression) {
LAB_0067b1de:
        if ((options.m_bits & 0x40) == 0) goto LAB_0067b1e4;
      }
      else {
        if (SVar3 != LogicalImplicationExpression) goto LAB_0067b1e4;
        if ((options.m_bits & 4) == 0) goto LAB_0067b1b2;
      }
LAB_0067b259:
      bVar7 = false;
    }
    if (!bVar7) {
      iVar4 = slang::syntax::SyntaxFacts::getPrecedence(LogicalOrExpression);
      if (precedence < iVar4 && (options.m_bits & 1) == 0) {
        bVar7 = local_98.kind == Question;
        if ((local_98.kind == MatchesKeyword) || (local_98.kind == TripleAnd)) {
          bVar7 = isConditionalExpression(this);
        }
        if (bVar7 != false) {
          Token::Token(&local_40);
          predicate = parseConditionalPredicate
                                (this,&local_d0->super_ExpressionSyntax,Question,&local_40);
          AVar10 = parseAttributes(this);
          if ((options.m_bits >> 8 & 1) != 0) {
            errorIfAttributes(this,AVar10);
          }
          pEVar5 = parseSubExpression(this,options,iVar4 + -1);
          TVar8 = ParserBase::expect(&this->super_ParserBase,Colon);
          right = parseSubExpression(this,options,iVar4 + -1);
          local_88.info._0_4_ = 1;
          local_78 = (SyntaxNode *)0x0;
          pSStack_70 = (SyntaxNode *)0x0;
          local_88._0_8_ = &PTR_getChild_00cb67f8;
          local_68 = AVar10._M_extent._M_extent_value._M_extent_value;
          local_60 = AVar10;
          local_50 = TVar8;
          local_d0 = slang::syntax::SyntaxFactory::conditionalExpression
                               (this_00,predicate,local_40,
                                (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_88,
                                pEVar5,TVar8,right);
        }
      }
      return &local_d0->super_ExpressionSyntax;
    }
  } while( true );
}

Assistant:

ExpressionSyntax& Parser::parseBinaryExpression(ExpressionSyntax* left,
                                                bitmask<ExpressionOptions> options,
                                                int precedence) {
    Token current;
    while (true) {
        // either a binary operator, or we're done
        current = peek();
        auto opKind = getBinaryExpression(current.kind);
        if (opKind == SyntaxKind::Unknown) {
            break;
        }
        else if (opKind == SyntaxKind::LogicalImplicationExpression &&
                 options.has(ExpressionOptions::ConstraintContext)) {
            // the implication operator in constraint blocks is special, we don't handle it here
            break;
        }
        else if ((opKind == SyntaxKind::LogicalAndExpression ||
                  opKind == SyntaxKind::LogicalOrExpression) &&
                 options.has(ExpressionOptions::BinsSelectContext)) {
            // The && and || operators in a bins select expression are part of the bins select
            // and not part of this nested sub expression.
            break;
        }
        else if (opKind == SyntaxKind::MultiplyExpression &&
                 peek(1).kind == TokenKind::CloseParenthesis && peek(1).trivia().empty()) {
            // This is an end-of-attribute token, not a multiply.
            break;
        }
        else if (opKind == SyntaxKind::LessThanEqualExpression &&
                 options.has(ExpressionOptions::ProceduralAssignmentContext)) {
            // we have to special case '<=', which can be less than or nonblocking assignment
            // depending
            // on context
            opKind = SyntaxKind::NonblockingAssignmentExpression;
        }

        options &= ~ExpressionOptions::ProceduralAssignmentContext;

        // see if we should take this operator or if it's part of our parent due to precedence
        int newPrecedence = getPrecedence(opKind);
        if (newPrecedence < precedence)
            break;

        // if we have a precedence tie, check associativity
        if (newPrecedence == precedence && !isRightAssociative(opKind))
            break;

        // take the operator
        if (opKind == SyntaxKind::InsideExpression) {
            left = &parseInsideExpression(*left);
        }
        else if (opKind == SyntaxKind::ExpressionOrDist) {
            auto& dist = parseDistConstraintList();
            left = &factory.expressionOrDist(*left, dist);

            if (!options.has(ExpressionOptions::AllowDist)) {
                addDiag(diag::InvalidDistExpression, dist.dist.location()) << dist.sourceRange();
            }
        }
        else {
            auto opToken = consume();
            auto attributes = parseAttributes();
            auto& rightOperand = parseSubExpression(options, newPrecedence);
            left = &factory.binaryExpression(opKind, *left, opToken, attributes, rightOperand);

            if (isAssignmentOperator(opKind) || options.has(ExpressionOptions::DisallowAttrs))
                errorIfAttributes(attributes);
        }
    }

    // Handle conditional expressions (and their optional pattern matched predicate).
    // Only do this if we're not already within a conditional pattern context, and if
    // we're at the right precedence level (one lower than a logical-or) to take it.
    int logicalOrPrecedence = getPrecedence(SyntaxKind::LogicalOrExpression);
    if (!options.has(ExpressionOptions::PatternContext) && precedence < logicalOrPrecedence) {
        // If this is the start of a pattern predicate, check whether there's actually a
        // question mark coming up. Otherwise we might be a predicate inside a
        // statement which doesn't need the question.
        bool takeConditional = current.kind == TokenKind::Question;
        if (current.kind == TokenKind::MatchesKeyword || current.kind == TokenKind::TripleAnd)
            takeConditional = isConditionalExpression();

        if (takeConditional) {
            Token question;
            auto& predicate = parseConditionalPredicate(*left, TokenKind::Question, question);
            auto attributes = parseAttributes();
            if (options.has(ExpressionOptions::DisallowAttrs))
                errorIfAttributes(attributes);

            auto& lhs = parseSubExpression(options, logicalOrPrecedence - 1);
            auto colon = expect(TokenKind::Colon);
            auto& rhs = parseSubExpression(options, logicalOrPrecedence - 1);
            left = &factory.conditionalExpression(predicate, question, attributes, lhs, colon, rhs);
        }
    }

    return *left;
}